

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnns_index.h
# Opt level: O0

void __thiscall
gnns::Gnns_Index<L2Distance<float>_>::knn_search
          (Gnns_Index<L2Distance<float>_> *this,Matrix<float> *queries,Matrix<unsigned_int> *indices
          ,Matrix<float> *dists,size_t_conflict knn,Search_Params *params)

{
  ostream *poVar1;
  time_t tVar2;
  float *query;
  uint *index;
  float *dist;
  uint local_3c;
  int i;
  Search_Params *params_local;
  size_t_conflict knn_local;
  Matrix<float> *dists_local;
  Matrix<unsigned_int> *indices_local;
  Matrix<float> *queries_local;
  Gnns_Index<L2Distance<float>_> *this_local;
  
  if (queries->cols != this->vec_len) {
    __assert_fail("queries.cols==vec_len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Kejie-Wang[P]gnns/algorithms/gnns_index.h"
                  ,0x5a,
                  "void gnns::Gnns_Index<L2Distance<float>>::knn_search(const Matrix<ElementType> &, Matrix<IndexType> &, Matrix<DistanceType>, size_t, const Search_Params &) [Distance = L2Distance<float>]"
                 );
  }
  if (indices->rows < queries->rows) {
    __assert_fail("indices.rows>=queries.rows",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Kejie-Wang[P]gnns/algorithms/gnns_index.h"
                  ,0x5b,
                  "void gnns::Gnns_Index<L2Distance<float>>::knn_search(const Matrix<ElementType> &, Matrix<IndexType> &, Matrix<DistanceType>, size_t, const Search_Params &) [Distance = L2Distance<float>]"
                 );
  }
  if (dists->rows < queries->rows) {
    __assert_fail("dists.rows>=queries.rows",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Kejie-Wang[P]gnns/algorithms/gnns_index.h"
                  ,0x5c,
                  "void gnns::Gnns_Index<L2Distance<float>>::knn_search(const Matrix<ElementType> &, Matrix<IndexType> &, Matrix<DistanceType>, size_t, const Search_Params &) [Distance = L2Distance<float>]"
                 );
  }
  if (knn <= indices->cols) {
    if (knn <= dists->cols) {
      if ((ulong)this->k < params->E) {
        poVar1 = std::operator<<((ostream *)&std::cout,
                                 "WARNINGS: The search expand E in param exceeds the k (param of the build knn graph)"
                                );
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<((ostream *)&std::cout,"WARNINGS: The procedure will use k(");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->k);
        poVar1 = std::operator<<(poVar1,")");
        poVar1 = std::operator<<(poVar1," as the search expand.");
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<((ostream *)&std::cout,
                                 "WARNINGS: For using a larger search expand, you can rebuild the graph with a larger k."
                                );
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      }
      tVar2 = time((time_t *)0x0);
      srand((uint)tVar2);
      for (local_3c = 0; local_3c < queries->rows; local_3c = local_3c + 1) {
        query = Matrix<float>::operator[](queries,local_3c);
        index = Matrix<unsigned_int>::operator[](indices,local_3c);
        dist = Matrix<float>::operator[](dists,local_3c);
        find_neighbors(this,query,index,dist,knn,params);
      }
      return;
    }
    __assert_fail("dists.cols>=knn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Kejie-Wang[P]gnns/algorithms/gnns_index.h"
                  ,0x5e,
                  "void gnns::Gnns_Index<L2Distance<float>>::knn_search(const Matrix<ElementType> &, Matrix<IndexType> &, Matrix<DistanceType>, size_t, const Search_Params &) [Distance = L2Distance<float>]"
                 );
  }
  __assert_fail("indices.cols>=knn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Kejie-Wang[P]gnns/algorithms/gnns_index.h"
                ,0x5d,
                "void gnns::Gnns_Index<L2Distance<float>>::knn_search(const Matrix<ElementType> &, Matrix<IndexType> &, Matrix<DistanceType>, size_t, const Search_Params &) [Distance = L2Distance<float>]"
               );
}

Assistant:

void knn_search(const Matrix<ElementType>& queries,
            Matrix<IndexType>& indices,
            Matrix<DistanceType> dists,
            size_t knn,
            const Search_Params& params)
        {
            //assert the vector in same dim
            assert(queries.cols==vec_len);
            assert(indices.rows>=queries.rows);
            assert(dists.rows>=queries.rows);
            assert(indices.cols>=knn);
            assert(dists.cols>=knn);

            if(params.E > k)
            {
                std::cout << "WARNINGS: The search expand E in param exceeds the k (param of the build knn graph)" << std::endl;
                std::cout << "WARNINGS: The procedure will use k(" << k << ")" << " as the search expand." << std::endl;
                std::cout << "WARNINGS: For using a larger search expand, you can rebuild the graph with a larger k." << std::endl;
            }
            srand((unsigned)time(0));
            //for each query
            for(int i=0;i<queries.rows;++i)
            {
                // std::cout << i << std::endl;
                find_neighbors(queries[i], indices[i], dists[i], knn, params);
            }
        }